

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_wo_reopen_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t metalen;
  void *pvVar3;
  fdb_kvs_handle *in_stack_fffffffffffffaa8;
  fdb_file_handle *in_stack_fffffffffffffab0;
  fdb_doc **in_stack_fffffffffffffab8;
  undefined1 *in_stack_fffffffffffffad0;
  fdb_file_info *in_stack_fffffffffffffae0;
  fdb_file_handle *in_stack_fffffffffffffae8;
  char *local_500;
  fdb_file_info info;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_doc *pfStack_98;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db_new;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_new;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0x100;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fdb_open((fdb_file_handle **)bodybuf._120_8_,(char *)bodybuf._112_8_,(fdb_config *)bodybuf._104_8_
          );
  fdb_kvs_open_default
            (in_stack_fffffffffffffab0,(fdb_kvs_handle **)in_stack_fffffffffffffaa8,
             (fdb_kvs_config *)0x1055c5);
  fVar1 = fdb_set_log_callback(db_new,logCallbackFunc,"compact_wo_reopen_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x118);
    compact_wo_reopen_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x118,"void compact_wo_reopen_test()");
    }
  }
  fdb_open((fdb_file_handle **)bodybuf._120_8_,(char *)bodybuf._112_8_,(fdb_config *)bodybuf._104_8_
          );
  fdb_kvs_open_default
            (in_stack_fffffffffffffab0,(fdb_kvs_handle **)in_stack_fffffffffffffaa8,
             (fdb_kvs_config *)0x105670);
  pvVar3 = (void *)0x105687;
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"compact_wo_reopen_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pvVar3 = (void *)0x1056ba;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x11d);
    compact_wo_reopen_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x11d,"void compact_wo_reopen_test()");
    }
  }
  for (n = 0; n < 3; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    in_stack_fffffffffffffad0 = &stack0xfffffffffffffaa8 + (long)n * 8;
    in_stack_fffffffffffffae0 = (fdb_file_info *)strlen(metabuf + 0xf8);
    in_stack_fffffffffffffae8 = (fdb_file_handle *)(bodybuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x1057c0;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                   (size_t)in_stack_fffffffffffffaa8,pvVar3,metalen,(void *)0x1057f7,
                   (size_t)in_stack_fffffffffffffad0);
    pvVar3 = (void *)0x105813;
    fdb_set(db_new,*(fdb_doc **)(&stack0xfffffffffffffaa8 + (long)n * 8));
  }
  fdb_doc_create(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                 (size_t)in_stack_fffffffffffffaa8,pvVar3,0,(void *)0x105879,
                 (size_t)in_stack_fffffffffffffad0);
  pfStack_98->deleted = true;
  fdb_set(db_new,pfStack_98);
  fdb_doc_free((fdb_doc *)0x1058a4);
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffaa8,'\0');
  pvVar3 = (void *)0x1058c2;
  fdb_compact(in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
  n = 0;
  do {
    if (2 < n) {
      fdb_get_file_info(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
      iVar2 = strcmp("./compact_test2",local_500);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x149);
        compact_wo_reopen_test::__test_pass = 0;
        iVar2 = strcmp("./compact_test2",local_500);
        if (iVar2 != 0) {
          __assert_fail("!strcmp(\"./compact_test2\", info.filename)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x149,"void compact_wo_reopen_test()");
        }
      }
      for (n = 0; n < 3; n = n + 1) {
        fdb_doc_free((fdb_doc *)0x105c20);
      }
      fdb_kvs_close(in_stack_fffffffffffffaa8);
      fdb_kvs_close(in_stack_fffffffffffffaa8);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffffaa8);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffffaa8);
      fdb_shutdown();
      memleak_end();
      if (compact_wo_reopen_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","compaction without reopen test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","compaction without reopen test");
      }
      return;
    }
    fdb_doc_create(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                   (size_t)in_stack_fffffffffffffaa8,pvVar3,0,(void *)0x10591d,
                   (size_t)in_stack_fffffffffffffad0);
    fVar1 = fdb_get((fdb_kvs_handle *)doc,pfStack_98);
    if (n == 1) {
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x140);
        compact_wo_reopen_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
          __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x140,"void compact_wo_reopen_test()");
        }
      }
    }
    else {
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x13c);
        compact_wo_reopen_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x13c,"void compact_wo_reopen_test()");
        }
      }
      iVar2 = memcmp(pfStack_98->meta,
                     *(void **)(*(long *)(&stack0xfffffffffffffaa8 + (long)n * 8) + 0x38),
                     pfStack_98->metalen);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(&stack0xfffffffffffffaa8 + (long)n * 8) + 0x38),
                pfStack_98->meta,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x13d);
        compact_wo_reopen_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x13d,"void compact_wo_reopen_test()");
      }
      iVar2 = memcmp(pfStack_98->body,
                     *(void **)(*(long *)(&stack0xfffffffffffffaa8 + (long)n * 8) + 0x40),
                     pfStack_98->bodylen);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(&stack0xfffffffffffffaa8 + (long)n * 8) + 0x40),
                pfStack_98->body,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x13e);
        compact_wo_reopen_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x13e,"void compact_wo_reopen_test()");
      }
    }
    pvVar3 = (void *)0x105b55;
    fdb_doc_free((fdb_doc *)0x105b55);
    n = n + 1;
  } while( true );
}

Assistant:

void compact_wo_reopen_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile, *dbfile_new;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_new;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_wo_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_open(&dbfile_new, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile_new, &db_new, &kvs_config);
    status = fdb_set_log_callback(db_new, logCallbackFunc,
                                  (void *) "compact_wo_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // retrieve documents using the other handle without close/re-open
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db_new, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check the other handle's filename
    fdb_file_info info;
    fdb_get_file_info(dbfile_new, &info);
    TEST_CHK(!strcmp("./compact_test2", info.filename));

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_kvs_close(db_new);
    fdb_close(dbfile);
    fdb_close(dbfile_new);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction without reopen test");
}